

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::Triangle::CreateTriangles
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,TriangleMesh *mesh,Allocator alloc)

{
  ShapeHandle *pSVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t n;
  long in_FS_OFFSET;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  TriangleMesh *mesh_local;
  int vb;
  size_t va;
  undefined4 extraout_var;
  
  mesh_local = mesh;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&CreateTriangles::allMeshesLock);
  if (iVar4 == 0) {
    va = allMeshes->nStored;
    vb = -0x80000000;
    if (va < 0xffffffff80000000) {
      pstd::
      vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
      ::push_back(allMeshes,&mesh_local);
      pthread_mutex_unlock((pthread_mutex_t *)&CreateTriangles::allMeshesLock);
      n = (size_t)mesh_local->nTriangles;
      (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
      __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
      __return_storage_ptr__->nAlloc = 0;
      __return_storage_ptr__->nStored = 0;
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
                (__return_storage_ptr__,n);
      if (n != 0) {
        memset(__return_storage_ptr__->ptr,0,n * 8);
      }
      __return_storage_ptr__->nStored = n;
      if ((long)mesh_local->nTriangles == 0) {
        uVar5 = 0;
      }
      else {
        iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                          (alloc.memoryResource,(long)mesh_local->nTriangles << 3,4);
        uVar5 = CONCAT44(extraout_var,iVar4);
      }
      iVar4 = mesh_local->nTriangles;
      if (0 < (long)iVar4) {
        pSVar1 = __return_storage_ptr__->ptr;
        auVar8 = vpbroadcastq_avx512f();
        auVar7 = vpbroadcastd_avx512vl();
        auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        lVar6 = 0;
        auVar10 = vpbroadcastq_avx512f();
        auVar11 = vpbroadcastq_avx512f(ZEXT816(0x4000000000000));
        auVar12 = vpbroadcastq_avx512f(ZEXT816(8));
        auVar14._8_4_ = 8;
        auVar14._0_8_ = 0x800000008;
        auVar14._12_4_ = 8;
        auVar14._16_4_ = 8;
        auVar14._20_4_ = 8;
        auVar14._24_4_ = 8;
        auVar14._28_4_ = 8;
        do {
          uVar3 = vpcmpuq_avx512f(auVar9,auVar8,2);
          auVar13 = vpsllq_avx512f(auVar9,3);
          auVar13 = vpaddq_avx512f(auVar10,auVar13);
          vpscatterqd_avx512f(ZEXT832(uVar5) + auVar9._0_32_ * (undefined1  [32])0x8,uVar3,auVar7);
          vpscatterqd_avx512f(ZEXT832(4) + auVar13._0_32_,uVar3,auVar2);
          auVar13 = vporq_avx512f(auVar13,auVar11);
          auVar13 = vmovdqu64_avx512f(auVar13);
          *(undefined1 (*) [64])
           ((long)&(pSVar1->
                   super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                   ).bits + lVar6) = auVar13;
          auVar9 = vpaddq_avx512f(auVar9,auVar12);
          auVar2 = vpaddd_avx2(auVar2,auVar14);
          lVar6 = lVar6 + 0x40;
        } while ((ulong)(iVar4 + 7U >> 3) << 6 != lVar6);
      }
      *(long *)(in_FS_OFFSET + -0x3f8) = *(long *)(in_FS_OFFSET + -0x3f8) + (long)iVar4 * 8;
      return __return_storage_ptr__;
    }
  }
  else {
    std::__throw_system_error(iVar4);
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
             ,0x10a,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [18])"allMeshes->size()"
             ,(char (*) [8])"1 << 31",(char (*) [18])"allMeshes->size()",&va,(char (*) [8])"1 << 31"
             ,&vb);
}

Assistant:

pstd::vector<ShapeHandle> Triangle::CreateTriangles(const TriangleMesh *mesh,
                                                    Allocator alloc) {
    static std::mutex allMeshesLock;
    allMeshesLock.lock();
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());
    allMeshes->push_back(mesh);
    allMeshesLock.unlock();

    pstd::vector<ShapeHandle> tris(mesh->nTriangles, alloc);
    Triangle *t = alloc.allocate_object<Triangle>(mesh->nTriangles);
    for (int i = 0; i < mesh->nTriangles; ++i) {
        alloc.construct(&t[i], meshIndex, i);
        tris[i] = &t[i];
    }
    triangleBytes += mesh->nTriangles * sizeof(Triangle);
    return tris;
}